

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O0

uchar * nvpair_unpack_string(_Bool isbe,nvpair_t *nvp,uchar *ptr,size_t *leftp)

{
  int *piVar1;
  size_t sVar2;
  char *pcVar3;
  size_t *leftp_local;
  uchar *ptr_local;
  nvpair_t *nvp_local;
  uchar *puStack_10;
  _Bool isbe_local;
  
  if (nvp->nvp_type == 4) {
    if ((*leftp < nvp->nvp_datasize) || (nvp->nvp_datasize == 0)) {
      piVar1 = __errno_location();
      *piVar1 = 0x16;
      puStack_10 = (uchar *)0x0;
    }
    else {
      sVar2 = strnlen((char *)ptr,nvp->nvp_datasize);
      if (sVar2 == nvp->nvp_datasize - 1) {
        pcVar3 = strdup((char *)ptr);
        nvp->nvp_data = (uint64_t)pcVar3;
        if (nvp->nvp_data == 0) {
          puStack_10 = (uchar *)0x0;
        }
        else {
          puStack_10 = ptr + nvp->nvp_datasize;
          *leftp = *leftp - nvp->nvp_datasize;
        }
      }
      else {
        piVar1 = __errno_location();
        *piVar1 = 0x16;
        puStack_10 = (uchar *)0x0;
      }
    }
    return puStack_10;
  }
  __assert_fail("nvp->nvp_type == 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                ,0x2fb,
                "const unsigned char *nvpair_unpack_string(_Bool, nvpair_t *, const unsigned char *, size_t *)"
               );
}

Assistant:

const unsigned char *
nvpair_unpack_string(bool isbe __unused, nvpair_t *nvp,
    const unsigned char *ptr, size_t *leftp)
{

	PJDLOG_ASSERT(nvp->nvp_type == NV_TYPE_STRING);

	if (*leftp < nvp->nvp_datasize || nvp->nvp_datasize == 0) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}

	if (strnlen((const char *)ptr, nvp->nvp_datasize) !=
	    nvp->nvp_datasize - 1) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}

	nvp->nvp_data = (uint64_t)(uintptr_t)nv_strdup((const char *)ptr);
	if (nvp->nvp_data == 0)
		return (NULL);

	ptr += nvp->nvp_datasize;
	*leftp -= nvp->nvp_datasize;

	return (ptr);
}